

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O3

string * generate_page_buttons_abi_cxx11_(string *__return_storage_ptr__,LadderDatabase *db)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  string local_60;
  ulong local_40;
  size_t local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40 = RenX::LadderDatabase::getEntries();
  local_38 = pluginInstance.entries_per_page;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,
             "<div id=\"leaderboard-paging\">",0x1d);
  if (local_40 != 0) {
    lVar1 = 1;
    uVar2 = 0;
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"<span class=\"leaderboard-page\"><a href=\"?start=",0x2f);
      string_printf_abi_cxx11_(&local_60,"%u",uVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (RenX::default_ladder_database != db) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"&database=",10);
        auVar3 = RenX::LadderDatabase::getName();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,auVar3._8_8_,auVar3._0_8_);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\">",2);
      string_printf_abi_cxx11_(&local_60,"%u",lVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"</a></span>",0xb);
      uVar2 = uVar2 + local_38;
      lVar1 = lVar1 + 1;
    } while (uVar2 < local_40);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"</div>",6);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_page_buttons(RenX::LadderDatabase *db) {
	std::string result;
	size_t entry_count = db->getEntries();
	size_t entries_per_page = pluginInstance.getEntriesPerPage();

	result = R"html(<div id="leaderboard-paging">)html"sv;

	size_t entry_index = 0, page_index = 1;
	while (entry_index < entry_count) {
		// Add page
		result += R"html(<span class="leaderboard-page"><a href="?start=)html"sv;
		result += string_printf("%u", entry_index);
		if (db != RenX::default_ladder_database) {
			result += "&database="sv;
			result += db->getName();
		}
		result += R"html(">)html"sv;
		result += string_printf("%u", page_index);
		result += R"html(</a></span>)html"sv;

		// Increment indexes
		entry_index += entries_per_page;
		++page_index;
	}

	result += R"html(</div>)html"sv;
	return result;
}